

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O0

void get_spell_info(wchar_t spell_index,char *p,size_t len)

{
  class_spell_conflict *pcVar1;
  undefined1 local_80 [8];
  spell_info_iteration_state ist;
  effect *effect;
  size_t len_local;
  char *p_local;
  wchar_t spell_index_local;
  
  pcVar1 = spell_by_index(player,spell_index);
  ist._80_8_ = pcVar1->effect;
  memset(local_80,0,0x58);
  *p = '\0';
  for (; ist._80_8_ != 0; ist._80_8_ = *(undefined8 *)ist._80_8_) {
    spell_effect_append_value_info
              ((effect *)ist._80_8_,p,len,(spell_info_iteration_state *)local_80);
  }
  return;
}

Assistant:

void get_spell_info(int spell_index, char *p, size_t len)
{
	struct effect *effect = spell_by_index(player, spell_index)->effect;
	struct spell_info_iteration_state ist = {
		NULL, "", { 0, 0, 0, 0 }, { 0, 0, 0, 0 }, false };

	p[0] = '\0';

	while (effect) {
		spell_effect_append_value_info(effect, p, len, &ist);
		effect = effect->next;
	}
}